

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int string_buffer_widen(StringBuffer *s,int size)

{
  void *pvVar1;
  int in_ESI;
  size_t *in_RDI;
  void *unaff_retaddr;
  JSContext *in_stack_00000008;
  int i;
  size_t slack;
  JSString *str;
  int local_2c;
  ulong local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (*(int *)((long)in_RDI + 0x1c) == 0) {
    pvVar1 = js_realloc2(in_stack_00000008,unaff_retaddr,
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    if (pvVar1 == (void *)0x0) {
      iVar2 = string_buffer_set_error((StringBuffer *)0x1533c4);
    }
    else {
      local_2c = (int)in_RDI[2];
      while (iVar2 = local_2c + -1, 0 < local_2c) {
        *(ushort *)((long)pvVar1 + (long)iVar2 * 2 + 0x10) =
             (ushort)*(byte *)((long)pvVar1 + (long)iVar2 + 0x10);
        local_2c = iVar2;
      }
      *(undefined4 *)(in_RDI + 3) = 1;
      *(int *)((long)in_RDI + 0x14) = in_ESI + (int)(local_28 >> 1);
      in_RDI[1] = (size_t)pvVar1;
      iVar2 = 0;
    }
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static no_inline int string_buffer_widen(StringBuffer *s, int size)
{
    JSString *str;
    size_t slack;
    int i;

    if (s->error_status)
        return -1;

    str = js_realloc2(s->ctx, s->str, sizeof(JSString) + (size << 1), &slack);
    if (!str)
        return string_buffer_set_error(s);
    size += slack >> 1;
    for(i = s->len; i-- > 0;) {
        str->u.str16[i] = str->u.str8[i];
    }
    s->is_wide_char = 1;
    s->size = size;
    s->str = str;
    return 0;
}